

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_stable_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  int local_44;
  REF_INT ref_malloc_init_i;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT nnode;
  REF_INT node;
  REF_INT **n2o_ptr_local;
  REF_INT **o2n_ptr_local;
  REF_NODE ref_node_local;
  
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x34d,
           "ref_node_stable_compact","malloc *o2n_ptr of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pRVar1 = (REF_INT *)malloc((long)ref_node->max << 2);
    *o2n_ptr = pRVar1;
    if (*o2n_ptr == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x34d,
             "ref_node_stable_compact","malloc *o2n_ptr of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (local_44 = 0; local_44 < ref_node->max; local_44 = local_44 + 1) {
        (*o2n_ptr)[local_44] = -1;
      }
      pRVar1 = *o2n_ptr;
      if (ref_node->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x34f,"ref_node_stable_compact","malloc *n2o_ptr of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)ref_node->n << 2);
        *n2o_ptr = pRVar2;
        if (*n2o_ptr == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x34f,"ref_node_stable_compact","malloc *n2o_ptr of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          pRVar2 = *n2o_ptr;
          o2n._0_4_ = 0;
          for (o2n._4_4_ = 0; o2n._4_4_ < ref_node->max; o2n._4_4_ = o2n._4_4_ + 1) {
            if (((-1 < o2n._4_4_) && (o2n._4_4_ < ref_node->max)) &&
               (-1 < ref_node->global[o2n._4_4_])) {
              pRVar1[o2n._4_4_] = (int)o2n;
              o2n._0_4_ = (int)o2n + 1;
            }
          }
          if ((int)o2n == ref_node->n) {
            for (o2n._4_4_ = 0; o2n._4_4_ < ref_node->max; o2n._4_4_ = o2n._4_4_ + 1) {
              if (((-1 < o2n._4_4_) && (o2n._4_4_ < ref_node->max)) &&
                 (-1 < ref_node->global[o2n._4_4_])) {
                pRVar2[pRVar1[o2n._4_4_]] = o2n._4_4_;
              }
            }
            ref_node_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x359,"ref_node_stable_compact","nnode miscount");
            ref_node_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_stable_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                           REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    nnode++;
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}